

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void units::shorten_number(string *unit_string,size_t loc,size_t length)

{
  pointer pcVar1;
  size_t sVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  cVar4 = pcVar1[loc];
  if (cVar4 == '.') {
    cVar4 = pcVar1[loc + 1];
  }
  std::__cxx11::string::erase((ulong)unit_string,loc);
  if (cVar4 == '9') {
    pcVar1 = (unit_string->_M_dataplus)._M_p;
    cVar4 = pcVar1[loc - 1];
    if (cVar4 == '9') {
      pcVar1 = (unit_string->_M_dataplus)._M_p;
      if (pcVar1[loc - 1] == '9') {
        pcVar3 = pcVar1 + (loc - 1);
        sVar2 = 1;
        lVar5 = loc - 1;
        do {
          *pcVar3 = '0';
          lVar6 = lVar5 + -1;
          if (lVar5 == 0) {
            lVar6 = 0;
            sVar2 = loc;
            break;
          }
          sVar2 = sVar2 + 1;
          pcVar3 = (unit_string->_M_dataplus)._M_p + lVar5 + -1;
          lVar5 = lVar6;
        } while (*pcVar3 == '9');
      }
      else {
        lVar6 = loc - 1;
        sVar2 = 1;
      }
      if ((sVar2 == loc) && (*(unit_string->_M_dataplus)._M_p == '0')) {
        std::__cxx11::string::_M_replace_aux((ulong)unit_string,0,0,'\x01');
        return;
      }
      pcVar1 = (unit_string->_M_dataplus)._M_p;
      cVar4 = pcVar1[lVar6];
      if (9 < (byte)(cVar4 - 0x30U)) {
        std::__cxx11::string::insert((ulong)unit_string,lVar6 + 1,'\x01');
        return;
      }
      pcVar1[lVar6] = cVar4 + '\x01';
    }
    else {
      pcVar1[loc - 1] = cVar4 + '\x01';
    }
  }
  return;
}

Assistant:

static void shorten_number(std::string& unit_string, size_t loc, size_t length)
{
    auto c = unit_string[loc];
    if (c == '.') {
        c = unit_string[loc + 1];
    }
    unit_string.erase(loc, length);
    if (c == '9') {
        if (unit_string[loc - 1] != '9') {
            ++unit_string[loc - 1];
        } else {
            int kk = 1;
            while (unit_string[loc - kk] == '9') {
                unit_string[loc - kk] = '0';
                if (loc - kk == 0) {
                    break;
                }
                ++kk;
            }
            if (loc - kk == 0 && unit_string[0] == '0') {
                unit_string.insert(unit_string.begin(), '1');
            } else {
                if (isDigitCharacter(unit_string[loc - kk])) {
                    ++unit_string[loc - kk];
                } else {
                    unit_string.insert(loc - kk + 1, 1, '1');
                }
            }
        }
    }
}